

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

Expression * __thiscall
wasm::Walker<wasm::StubUnsupportedJSOpsPass,_wasm::Visitor<wasm::StubUnsupportedJSOpsPass,_void>_>::
replaceCurrent(Walker<wasm::StubUnsupportedJSOpsPass,_wasm::Visitor<wasm::StubUnsupportedJSOpsPass,_void>_>
               *this,Expression *expression)

{
  Function *pFVar1;
  iterator __it;
  mapped_type *pmVar2;
  unordered_map<wasm::Expression_*,_wasm::Function::DebugLocation,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>_>
  *this_00;
  Expression *local_40;
  Expression *curr;
  Expression *expression_local;
  DebugLocation location;
  
  pFVar1 = this->currFunction;
  if ((pFVar1 != (Function *)0x0) && ((pFVar1->debugLocations)._M_h._M_element_count != 0)) {
    this_00 = &pFVar1->debugLocations;
    local_40 = *this->replacep;
    curr = expression;
    __it = std::
           _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find(&this_00->_M_h,&local_40);
    if (__it.
        super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
        ._M_cur != (__node_type *)0x0) {
      location.fileIndex =
           *(BinaryLocation *)
            ((long)__it.
                   super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
                   ._M_cur + 0x18);
      expression_local =
           *(Expression **)
            ((long)__it.
                   super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
                   ._M_cur + 0x10);
      std::
      _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase(&this_00->_M_h,
              (const_iterator)
              __it.
              super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
              ._M_cur);
      pmVar2 = std::__detail::
               _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,&curr);
      pmVar2->columnNumber = location.fileIndex;
      *(Expression **)pmVar2 = expression_local;
      expression = curr;
    }
  }
  *this->replacep = expression;
  return expression;
}

Assistant:

Expression* replaceCurrent(Expression* expression) {
    // Copy debug info, if present.
    if (currFunction) {
      auto& debugLocations = currFunction->debugLocations;
      if (!debugLocations.empty()) {
        auto* curr = getCurrent();
        auto iter = debugLocations.find(curr);
        if (iter != debugLocations.end()) {
          auto location = iter->second;
          debugLocations.erase(iter);
          debugLocations[expression] = location;
        }
      }
    }
    return *replacep = expression;
  }